

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O1

Aig_Man_t * Ssw_LatchCorrespondence(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  Aig_Man_t *pAVar1;
  Ssw_Pars_t Pars;
  Ssw_Pars_t local_c0;
  
  if (pPars == (Ssw_Pars_t *)0x0) {
    pPars = &local_c0;
    memset(pPars,0,0xa8);
    local_c0.nFramesK = 1;
    local_c0.nFramesAddSim = 2;
    local_c0.fConstrs = 0;
    local_c0.fMergeFull = 0;
    local_c0.nMinDomSize = 100;
    local_c0.nItersStop = -1;
    local_c0.nResimDelta = 1000;
    local_c0.nStepsMax = -1;
    local_c0.fVerbose = 0;
    local_c0.fEquivDump = 0;
    local_c0.fPolarFlip = 0;
    local_c0.fLatchCorr = 0;
    local_c0.fConstCorr = 0;
    local_c0.fOutputCorr = 0;
    local_c0.fSemiFormal = 0;
    local_c0.fDynamic = 0;
    local_c0.fLocalSim = 0;
    local_c0.nSatVarMax = 1000;
    local_c0.nRecycleCalls = 0x32;
    local_c0.nSatVarMax2 = 5000;
    local_c0.nRecycleCalls2 = 0xfa;
    local_c0.nIters = 0;
    local_c0.fLatchCorrOpt = 1;
    local_c0.nBTLimit = 10000;
    local_c0.nBTLimitGlobal = 5000000;
  }
  pAVar1 = Ssw_SignalCorrespondence(pAig,pPars);
  return pAVar1;
}

Assistant:

Aig_Man_t * Ssw_LatchCorrespondence( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pRes;
    Ssw_Pars_t Pars;
    if ( pPars == NULL )
        Ssw_ManSetDefaultParamsLcorr( pPars = &Pars );
    pRes = Ssw_SignalCorrespondence( pAig, pPars );
//    if ( pPars->fConstrs && pPars->fVerbose )
//        Ssw_ReportConeReductions( pAig, pRes );
    return pRes;
}